

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

tuple<mjs::value,_mjs::value> * __thiscall
mjs::interpreter::impl::eval_call_member
          (tuple<mjs::value,_mjs::value> *__return_storage_ptr__,impl *this,expression *member)

{
  int iVar1;
  value l;
  value r;
  value local_a0;
  value local_78;
  value local_50;
  
  iVar1 = (*(member->super_syntax_node)._vptr_syntax_node[3])(member);
  if ((iVar1 == 9) &&
     ((iVar1 = *(int *)&member[1].super_syntax_node._vptr_syntax_node, iVar1 == 0x32 ||
      (iVar1 == 0x25)))) {
    eval(&local_78,this,
         (expression *)
         member[1].super_syntax_node.extend_.file.
         super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    get_value(&local_a0,this,&local_78);
    value::destroy(&local_78);
    eval(&local_78,this,
         (expression *)
         member[1].super_syntax_node.extend_.file.
         super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    make_reference(&local_50,this,&local_a0,&local_78);
    std::_Tuple_impl<0ul,mjs::value,mjs::value>::_Tuple_impl<mjs::value,mjs::value&,void>
              ((_Tuple_impl<0ul,mjs::value,mjs::value> *)__return_storage_ptr__,&local_50,&local_a0)
    ;
    value::destroy(&local_50);
    value::destroy(&local_78);
    value::destroy(&local_a0);
    if (iVar1 == 0x25) {
      return __return_storage_ptr__;
    }
    if (iVar1 == 0x32) {
      return __return_storage_ptr__;
    }
  }
  eval(&local_a0,this,member);
  std::_Tuple_impl<0ul,mjs::value,mjs::value>::_Tuple_impl<mjs::value,mjs::value_const&,void>
            ((_Tuple_impl<0ul,mjs::value,mjs::value> *)__return_storage_ptr__,&local_a0,
             (value *)&value::undefined);
  value::destroy(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

auto eval_call_member(const expression& member) {
        // For strict mode we need to check if the MemberExpresson results in a primtive type
        // to be able to pass it on to the called function (even if the expression occurs in
        // a non-strict context)
        if (member.type() == expression_type::binary) {
            const auto& be = static_cast<const binary_expression&>(member);
            if (is_reference_op(be.op())) {
                // Commit to handling the evaluation
                auto l = get_value(eval(be.lhs()));
                auto r = eval(be.rhs());
                return std::tuple(make_reference(l, r), l);
            }
        }
        return std::tuple(eval(member), value::undefined);
    }